

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_FRC(Context *ctx)

{
  char *pcVar1;
  
  if (((ctx->dest_arg).result_mod & 1) == 0) {
    if ((1 < ctx->major_ver) || (((ctx->dest_arg).writemask & 0xfffffffeU) == 2)) {
      return;
    }
    pcVar1 = "FRC writemask must be .y or .xy for shader model 1.x";
  }
  else {
    pcVar1 = "FRC destination can\'t use saturate modifier";
  }
  failf(ctx,"%s",pcVar1);
  return;
}

Assistant:

static void state_FRC(Context *ctx)
{
    const DestArgInfo *dst = &ctx->dest_arg;

    if (dst->result_mod & MOD_SATURATE)  // according to msdn...
        fail(ctx, "FRC destination can't use saturate modifier");

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        if (!writemask_y(dst->writemask) && !writemask_xy(dst->writemask))
            fail(ctx, "FRC writemask must be .y or .xy for shader model 1.x");
    } // else if
}